

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

void bson_iter_binary(bson_iter_t *iter,bson_subtype_t *subtype,uint32_t *binary_len,
                     uint8_t **binary)

{
  uint32_t uVar1;
  uint uVar2;
  uint8_t *puVar3;
  bson_subtype_t bVar4;
  undefined8 uVar5;
  char *pcVar6;
  
  if (iter == (bson_iter_t *)0x0) {
    pcVar6 = "iter";
    uVar5 = 0x35f;
  }
  else {
    if (binary_len != (uint32_t *)0x0 || binary == (uint8_t **)0x0) {
      puVar3 = iter->raw;
      if (puVar3[iter->type] == '\x05') {
        bVar4 = (bson_subtype_t)puVar3[iter->d2];
        if (subtype != (bson_subtype_t *)0x0) {
          *subtype = (uint)puVar3[iter->d2];
        }
        if (binary != (uint8_t **)0x0) {
          uVar1 = *(uint32_t *)(puVar3 + iter->d1);
          *binary_len = uVar1;
          uVar2 = iter->d3;
          puVar3 = iter->raw;
          *binary = puVar3 + uVar2;
          if (subtype != (bson_subtype_t *)0x0) {
            bVar4 = *subtype;
          }
          if (bVar4 == BSON_SUBTYPE_BINARY_DEPRECATED) {
            *binary_len = uVar1 - 4;
            *binary = puVar3 + uVar2 + 4;
          }
        }
      }
      else {
        if (binary != (uint8_t **)0x0) {
          *binary = (uint8_t *)0x0;
        }
        if (binary_len != (uint32_t *)0x0) {
          *binary_len = 0;
        }
        if (subtype != (bson_subtype_t *)0x0) {
          *subtype = BSON_SUBTYPE_BINARY;
        }
      }
      return;
    }
    pcVar6 = "!binary || binary_len";
    uVar5 = 0x360;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,uVar5,"bson_iter_binary",pcVar6);
  abort();
}

Assistant:

void
bson_iter_binary (const bson_iter_t *iter, /* IN */
                  bson_subtype_t *subtype, /* OUT */
                  uint32_t *binary_len,    /* OUT */
                  const uint8_t **binary)  /* OUT */
{
   bson_subtype_t backup;

   BSON_ASSERT (iter);
   BSON_ASSERT (!binary || binary_len);

   if (ITER_TYPE (iter) == BSON_TYPE_BINARY) {
      if (!subtype) {
         subtype = &backup;
      }

      *subtype = (bson_subtype_t) * (iter->raw + iter->d2);

      if (binary) {
         memcpy (binary_len, (iter->raw + iter->d1), sizeof (*binary_len));
         *binary_len = BSON_UINT32_FROM_LE (*binary_len);
         *binary = iter->raw + iter->d3;

         if (*subtype == BSON_SUBTYPE_BINARY_DEPRECATED) {
            *binary_len -= sizeof (int32_t);
            *binary += sizeof (int32_t);
         }
      }

      return;
   }

   if (binary) {
      *binary = NULL;
   }

   if (binary_len) {
      *binary_len = 0;
   }

   if (subtype) {
      *subtype = BSON_SUBTYPE_BINARY;
   }
}